

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_3> * __thiscall
tcu::faceForward<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *n,
          Vector<double,_3> *i,Vector<double,_3> *ref)

{
  double dVar1;
  Vector<double,_3> *res_1;
  long lVar2;
  double res;
  
  res_1 = __return_storage_ptr__;
  dVar1 = 0.0;
  lVar2 = 0;
  do {
    dVar1 = dVar1 + i->m_data[lVar2] * n->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (dVar1 < 0.0) {
    __return_storage_ptr__->m_data[2] = *(double *)(this + 0x10);
    dVar1 = *(double *)(this + 8);
    __return_storage_ptr__->m_data[0] = *(double *)this;
    __return_storage_ptr__->m_data[1] = dVar1;
    return res_1;
  }
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  lVar2 = 0;
  do {
    __return_storage_ptr__->m_data[lVar2] = -*(double *)(this + lVar2 * 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return res_1;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}